

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void raiseSeparatorWidget(QWidget *separatorWidget)

{
  bool bVar1;
  QObject *this;
  const_iterator o;
  QToolBar **ppQVar2;
  QToolBarLayout *pQVar3;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QToolBarLayout *toolBarLayout;
  QToolBar *toolBar;
  QList<QToolBar_*> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QToolBar_*> toolBars;
  FindChildOption in_stack_ffffffffffffff8c;
  QObject *in_stack_ffffffffffffffa0;
  QWidget *this_00;
  undefined8 in_stack_ffffffffffffffc8;
  QFlagsStorage<Qt::FindChildOption> options;
  const_iterator w;
  const_iterator local_30 [2];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  options.i = (Int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this = QObject::parent((QObject *)0x5761f5);
  QFlags<Qt::FindChildOption>::QFlags((QFlags<Qt::FindChildOption> *)this,in_stack_ffffffffffffff8c)
  ;
  QObject::findChildren<QToolBar*>(in_stack_ffffffffffffffa0,(FindChildOptions)options.i);
  local_30[0].i = (QToolBar **)&DAT_aaaaaaaaaaaaaaaa;
  local_30[0] = QList<QToolBar_*>::begin((QList<QToolBar_*> *)this);
  o = QList<QToolBar_*>::end((QList<QToolBar_*> *)this);
  do {
    w.i = o.i;
    bVar1 = QList<QToolBar_*>::const_iterator::operator!=(local_30,o);
    if (!bVar1) {
      QWidget::raise(in_RDI,(int)o.i);
LAB_00576301:
      QList<QToolBar_*>::~QList((QList<QToolBar_*> *)0x57630b);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    ppQVar2 = QList<QToolBar_*>::const_iterator::operator*(local_30);
    this_00 = &(*ppQVar2)->super_QWidget;
    QWidget::layout((QWidget *)0x5762a3);
    pQVar3 = qobject_cast<QToolBarLayout*>((QObject *)0x5762ab);
    if ((pQVar3 != (QToolBarLayout *)0x0) &&
       (((pQVar3->super_QLayout).super_QLayoutItem.field_0xc & 1) != 0)) {
      QWidget::stackUnder(this_00,(QWidget *)w.i);
      goto LAB_00576301;
    }
    QList<QToolBar_*>::const_iterator::operator++(local_30);
    o.i = w.i;
  } while( true );
}

Assistant:

static void raiseSeparatorWidget(QWidget *separatorWidget)
{
    Q_ASSERT(separatorWidget);

#if QT_CONFIG(toolbar)
    // Raise the separator widget, but make sure it doesn't go above
    // an expanded toolbar, as that would break mouse event hit testing.
    Q_ASSERT(separatorWidget->parent());
    const auto toolBars = separatorWidget->parent()->findChildren<QToolBar*>(Qt::FindDirectChildrenOnly);
    for (auto *toolBar : toolBars) {
        if (auto *toolBarLayout = qobject_cast<QToolBarLayout*>(toolBar->layout())) {
            if (toolBarLayout->expanded) {
                separatorWidget->stackUnder(toolBar);
                return;
            }
        }
    }
#endif

    separatorWidget->raise();
}